

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O2

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
Thread::extractTokens
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,Thread *this
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&this->selftext,&this->title);
  ResponseBase::extractTokensFromLine(__return_storage_ptr__,(ResponseBase *)this,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::set<Token> extractTokens() const {
			return extractTokensFromLine(selftext + title);
		}